

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyMemBackendPoolFree(SyMemBackend *pBackend,void *pChunk)

{
  uint uVar1;
  sxi32 sVar2;
  SyMemHeader *pChunk_00;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  uVar1 = *(uint *)((long)pChunk + -8);
  if ((uVar1 & 0xffff0000) == 0xdead0000) {
    pChunk_00 = (SyMemHeader *)((long)pChunk + -8);
    if ((short)uVar1 == -1) {
      MemBackendFree(pBackend,pChunk_00);
    }
    else {
      *pChunk_00 = *(SyMemHeader *)(pBackend->apPool + (uVar1 & 0xf));
      pBackend->apPool[uVar1 & 0xf] = pChunk_00;
    }
    sVar2 = 0;
  }
  else {
    sVar2 = -0x18;
  }
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendPoolFree(SyMemBackend *pBackend, void * pChunk)
{
	sxi32 rc;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) || pChunk == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	rc = MemBackendPoolFree(&(*pBackend), pChunk);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return rc;
}